

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_geodesic.cpp
# Opt level: O0

array<geometrycentral::Vector2,_3UL> *
geometrycentral::surface::anon_unknown_2::vertexCoordinatesInTriangle
          (IntrinsicGeometryInterface *geom,Face face)

{
  Vector2 *pVVar1;
  Face *this;
  long in_RSI;
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2> *in_RDI;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> e;
  Vector2 VVar2;
  Face *in_stack_ffffffffffffff90;
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2> *this_00;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
  in_stack_ffffffffffffffa8;
  
  in_RDI->mesh = (ParentMeshT *)0x0;
  (in_RDI->defaultValue).x = 0.0;
  this_00 = in_RDI;
  Face::halfedge(in_stack_ffffffffffffff90);
  pVVar1 = MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::operator[]
                     (this_00,(Halfedge)in_stack_ffffffffffffffa8);
  (in_RDI->defaultValue).y = pVVar1->x;
  (in_RDI->data).super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (Vector2 *)pVVar1->y;
  this = (Face *)(in_RSI + 0x5b0);
  e = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>)
      Face::halfedge(this);
  Halfedge::next((Halfedge *)this);
  Halfedge::next((Halfedge *)this);
  pVVar1 = MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::operator[]
                     (this_00,(Halfedge)e);
  VVar2 = Vector2::operator-(pVVar1);
  *(Vector2 *)
   &(in_RDI->data).super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
    m_storage.m_rows = VVar2;
  return (array<geometrycentral::Vector2,_3UL> *)this_00;
}

Assistant:

inline std::array<Vector2, 3> vertexCoordinatesInTriangle(IntrinsicGeometryInterface& geom, Face face) {
  return {Vector2{0., 0.}, geom.halfedgeVectorsInFace[face.halfedge()],
          -geom.halfedgeVectorsInFace[face.halfedge().next().next()]};
}